

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

void __thiscall Database::Database(Database *this,string *fname,bool initialize)

{
  byte in_DL;
  long in_RDI;
  path *__p;
  path *this_00;
  path *ppVar1;
  path fpath;
  Database *in_stack_000002e0;
  path *in_stack_fffffffffffffdc8;
  path *in_stack_fffffffffffffdd0;
  DatabaseConfig *in_stack_fffffffffffffe20;
  path local_128;
  path local_e8;
  path local_a8;
  v1 local_68 [87];
  byte local_11;
  
  local_11 = in_DL & 1;
  std::experimental::filesystem::v1::__cxx11::path::path(in_stack_fffffffffffffdd0);
  __p = (path *)(in_RDI + 0x40);
  std::experimental::filesystem::v1::__cxx11::path::path(in_stack_fffffffffffffdd0);
  this_00 = (path *)(in_RDI + 0x80);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
         *)0x1520e2);
  ppVar1 = (path *)(in_RDI + 0xb0);
  std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>::vector
            ((vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_> *)0x1520f8);
  std::
  vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
  ::vector((vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
            *)0x15210e);
  DatabaseConfig::DatabaseConfig(in_stack_fffffffffffffe20);
  *(undefined8 *)(in_RDI + 0xf0) = 0;
  std::
  unordered_map<unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>_>_>
  ::unordered_map((unordered_map<unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>_>_>
                   *)0x152147);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
            (this_00,&__p->_M_pathname);
  std::experimental::filesystem::v1::current_path_abi_cxx11_((v1 *)&local_e8);
  std::experimental::filesystem::v1::absolute(local_68,&local_a8,&local_e8);
  std::experimental::filesystem::v1::__cxx11::path::~path(in_stack_fffffffffffffdd0);
  std::experimental::filesystem::v1::__cxx11::path::~path(in_stack_fffffffffffffdd0);
  std::experimental::filesystem::v1::__cxx11::path::path(this_00,__p);
  std::experimental::filesystem::v1::__cxx11::path::filename(ppVar1);
  ppVar1 = &local_128;
  std::experimental::filesystem::v1::__cxx11::path::operator=(ppVar1,in_stack_fffffffffffffdc8);
  std::experimental::filesystem::v1::__cxx11::path::~path(ppVar1);
  std::experimental::filesystem::v1::__cxx11::path::~path(ppVar1);
  std::experimental::filesystem::v1::__cxx11::path::path(this_00,__p);
  std::experimental::filesystem::v1::__cxx11::path::parent_path();
  std::experimental::filesystem::v1::__cxx11::path::operator=(ppVar1,in_stack_fffffffffffffdc8);
  std::experimental::filesystem::v1::__cxx11::path::~path(ppVar1);
  std::experimental::filesystem::v1::__cxx11::path::~path(ppVar1);
  if ((local_11 & 1) != 0) {
    load_from_disk(in_stack_000002e0);
  }
  std::experimental::filesystem::v1::__cxx11::path::~path(ppVar1);
  return;
}

Assistant:

Database::Database(const std::string &fname, bool initialize)
    : last_task_id(0) {
    fs::path fpath = fs::absolute(fname);
    db_name = fs::path(fpath).filename();
    db_base = fs::path(fpath).parent_path();

    if (initialize) {
        load_from_disk();
    }
}